

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QPersistentModelIndex,_QHashDummyValue>::emplace<QHashDummyValue>
          (QHash<QPersistentModelIndex,_QHashDummyValue> *this,QPersistentModelIndex *key,
          QHashDummyValue *args)

{
  Data *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  QHash<QPersistentModelIndex,_QHashDummyValue> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = this->d;
  if (pDVar1 == (Data *)0x0) {
    local_28.d = (Data *)0x0;
  }
  else {
    if ((uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i < 2) {
      if (pDVar1->size < pDVar1->numBuckets >> 1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar2 = (piter)emplace_helper<QHashDummyValue>(this,key,args);
          return (iterator)pVar2;
        }
      }
      else {
        pVar2 = (piter)emplace_helper<QHashDummyValue>(this,key,(QHashDummyValue *)&local_28);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return (iterator)pVar2;
        }
      }
      goto LAB_0051e7ee;
    }
    local_28.d = pDVar1;
    if ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
      LOCK();
      (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  detach(this);
  pVar2 = (piter)emplace_helper<QHashDummyValue>(this,key,args);
  ~QHash(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
LAB_0051e7ee:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }